

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O3

void __thiscall
Diligent::QueryBase<Diligent::EngineVkImplTraits>::OnEndQuery
          (QueryBase<Diligent::EngineVkImplTraits> *this,DeviceContextImplType *pContext)

{
  QueryDesc *Args;
  DeviceContextImplType *pDVar1;
  char (*in_R8) [37];
  string msg;
  string local_40;
  
  if ((this->
      super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>)
      .m_Desc.Type == QUERY_TYPE_TIMESTAMP) {
    pDVar1 = (this->m_pContext).m_pObject;
    if (pDVar1 != pContext && pDVar1 != (DeviceContextImplType *)0x0) {
      (**(code **)((long)(this->
                         super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                         ).super_ObjectBase<Diligent::IQueryVk>.
                         super_RefCountedObject<Diligent::IQueryVk>.super_IQueryVk.super_IQuery.
                         super_IDeviceObject.super_IObject + 0x48))(this);
    }
    RefCntAutoPtr<Diligent::DeviceContextVkImpl>::operator=(&this->m_pContext,pContext);
  }
  else {
    Args = &(this->
            super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
            ).m_Desc;
    pDVar1 = (this->m_pContext).m_pObject;
    if (pDVar1 == (DeviceContextImplType *)0x0 || this->m_State != Querying) {
      FormatString<char[26],char_const*,char[27]>
                (&local_40,(Diligent *)"Attempting to end query \'",(char (*) [26])Args,
                 (char **)"\' that has not been begun.",(char (*) [27])in_R8);
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"OnEndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x95);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      pDVar1 = (this->m_pContext).m_pObject;
    }
    if (pDVar1 != pContext) {
      FormatString<char[8],char_const*,char[37]>
                (&local_40,(Diligent *)"Query \'",(char (*) [8])Args,
                 (char **)"\' has been begun by another context.",in_R8);
      DebugAssertionFailed
                (local_40._M_dataplus._M_p,"OnEndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x96);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  this->m_State = Ended;
  return;
}

Assistant:

void OnEndQuery(DeviceContextImplType* pContext)
    {
        if (this->m_Desc.Type != QUERY_TYPE_TIMESTAMP)
        {
            DEV_CHECK_ERR(m_State == QueryState::Querying && m_pContext != nullptr,
                          "Attempting to end query '", this->m_Desc.Name, "' that has not been begun.");
            DEV_CHECK_ERR(m_pContext == pContext, "Query '", this->m_Desc.Name, "' has been begun by another context.");
        }
        else
        {
            // Timestamp queries are never begun
            if (m_pContext != nullptr && m_pContext != pContext)
                Invalidate();

            m_pContext = pContext;
        }

        m_State = QueryState::Ended;
    }